

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_int>::addHolesAtEnd
          (HoleSet<unsigned_int> *this,uint lgSize,uint offset,uint limitLgSize)

{
  ulong uVar1;
  
  for (uVar1 = (ulong)lgSize; uVar1 < limitLgSize; uVar1 = uVar1 + 1) {
    this->holes[uVar1] = offset;
    offset = offset + 1 >> 1;
  }
  return;
}

Assistant:

void addHolesAtEnd(UIntType lgSize, UIntType offset,
                       UIntType limitLgSize = sizeof(HoleSet::holes) / sizeof(HoleSet::holes[0])) {
      // Add new holes of progressively larger sizes in the range [lgSize, limitLgSize) starting
      // from the given offset.  The idea is that you just allocated an lgSize-sized field from
      // an limitLgSize-sized space, such as a newly-added word on the end of the data segment.

      KJ_DREQUIRE(limitLgSize <= kj::size(holes));

      while (lgSize < limitLgSize) {
        KJ_DREQUIRE(holes[lgSize] == 0);
        KJ_DREQUIRE(offset % 2 == 1);
        holes[lgSize] = offset;
        ++lgSize;
        offset = (offset + 1) / 2;
      }
    }